

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void cpu_mips_realize_env_mips64(CPUMIPSState_conflict5 *env)

{
  CPUMIPSState_conflict5 *env_local;
  
  env->exception_base = 0xffffffffbfc00000;
  mmu_init(env,env->cpu_model);
  fpu_init(env,env->cpu_model);
  mvp_init(env,env->cpu_model);
  return;
}

Assistant:

void cpu_mips_realize_env(CPUMIPSState *env)
{
    env->exception_base = (int32_t)0xBFC00000;

    mmu_init(env, env->cpu_model);
    fpu_init(env, env->cpu_model);
    mvp_init(env, env->cpu_model);
}